

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O0

int optimize_meshfile(map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                      *nodes_map,
                     map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
                     *node_duplicated_data_map,
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *materials_map,
                     map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
                     *duplicated_material_data_map)

{
  int iVar1;
  map<int,material_duplication_data,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
  *this;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar2;
  _Self *p_Var3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  _Self *p_Var7;
  pointer ppVar8;
  ostream *poVar9;
  pointer ppVar10;
  void *pvVar11;
  __enable_if_t<is_constructible<value_type,_pair<int,_node_duplication_data>_>::value,_pair<iterator,_bool>_>
  _Var12;
  __enable_if_t<is_constructible<value_type,_pair<int,_material_duplication_data>_>::value,_pair<iterator,_bool>_>
  _Var13;
  _Self local_408;
  _Self local_400;
  iterator material_dupe_iterator;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  _Base_ptr local_3e0;
  _Base_ptr local_3d8;
  _Base_ptr local_3d0;
  _Self local_3c8;
  iterator material_holder_iterator;
  pair<int,_material_duplication_data> local_3ac;
  material_duplication_data local_3a0;
  material_duplication_data identified_material_duplication;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  iterator nested_material_iterator;
  _Self local_378;
  iterator materials_map_limit;
  iterator iStack_368;
  int material_duplicates_counter;
  iterator material_iterator;
  _Self local_358;
  _Self local_350;
  iterator dupe_iterator;
  _Self local_340;
  _Base_ptr local_338;
  _Base_ptr local_330;
  _Base_ptr local_328;
  _Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> local_320;
  _Base_ptr local_318;
  _Base_ptr local_310;
  _Base_ptr local_308;
  _Self local_300;
  iterator holder_iterator;
  pair<int,_node_duplication_data> local_2e4;
  node_duplication_data local_2d8;
  node_duplication_data duplication;
  _Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> local_2c0;
  iterator nested_iterator;
  _Self local_2a8 [3];
  allocator<char> local_289;
  string local_288 [8];
  string file_output_name;
  string logf_print_buffer;
  _Self local_240;
  iterator limit;
  iterator main_iterator;
  ofstream log_file;
  int local_30;
  int local_2c;
  int duplicates_counter;
  int exit_status;
  map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
  *duplicated_material_data_map_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *materials_map_local;
  map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
  *node_duplicated_data_map_local;
  map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
  *nodes_map_local;
  
  local_2c = 1;
  local_30 = 0;
  _duplicates_counter =
       (map<int,material_duplication_data,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
        *)duplicated_material_data_map;
  duplicated_material_data_map_local =
       (map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
        *)materials_map;
  materials_map_local =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)node_duplicated_data_map;
  node_duplicated_data_map_local =
       (map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
        *)nodes_map;
  std::ofstream::ofstream(&main_iterator);
  limit = std::
          map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
          ::begin((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                   *)node_duplicated_data_map_local);
  logf_print_buffer.field_2._8_8_ =
       std::
       map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
       ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
              *)node_duplicated_data_map_local);
  p_Var3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator--
                     ((_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_> *)
                      ((long)&logf_print_buffer.field_2 + 8));
  local_240._M_node = p_Var3->_M_node;
  std::__cxx11::string::string((string *)(file_output_name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"logfile.txt",&local_289);
  std::allocator<char>::~allocator(&local_289);
  std::operator|(_S_out,_S_app);
  std::ofstream::open((string *)&main_iterator,(_Ios_Openmode)local_288);
  std::operator<<((ostream *)&main_iterator,
                  "================== Mesh Duplication Reduction ===============\n");
  std::operator<<((ostream *)&main_iterator,
                  "--------------------- Original Nodes List -------------------\n");
  while( true ) {
    local_2a8[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
         ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                *)node_duplicated_data_map_local);
    bVar2 = std::operator!=(&limit,local_2a8);
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(&main_iterator,ppVar5->first);
    poVar9 = std::operator<<(poVar9,": [");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[0]);
    poVar9 = std::operator<<(poVar9,", ");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[1]);
    poVar9 = std::operator<<(poVar9,", ");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[2]);
    std::operator<<(poVar9,"]\n");
    std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++(&limit,0);
  }
  nested_iterator =
       std::
       map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
       ::begin((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                *)node_duplicated_data_map_local);
  limit = nested_iterator;
  while (bVar2 = std::operator!=(&limit,&local_240), bVar2) {
    local_2c0._M_node = limit._M_node;
    std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++(&local_2c0,0);
    while( true ) {
      duplication = (node_duplication_data)
                    std::
                    map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                    ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                           *)node_duplicated_data_map_local);
      bVar2 = std::operator!=(&local_2c0,(_Self *)&duplication);
      if (!bVar2) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&local_2c0);
      bVar2 = co_ord_compare(&ppVar5->second,&ppVar4->second);
      if (bVar2) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
        local_2d8.original_node = ppVar5->first;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&local_2c0)
        ;
        this_00 = materials_map_local;
        local_2d8.duplicated_node = ppVar5->first;
        local_30 = local_30 + 1;
        std::pair<int,_node_duplication_data>::pair<int_&,_node_duplication_data_&,_true>
                  (&local_2e4,&local_30,&local_2d8);
        _Var12 = std::
                 map<int,node_duplication_data,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
                 ::insert<std::pair<int,node_duplication_data>>
                           ((map<int,node_duplication_data,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
                             *)this_00,&local_2e4);
        holder_iterator._M_node = (_Base_ptr)_Var12.first._M_node;
        local_300._M_node = local_2c0._M_node;
        local_308 = (_Base_ptr)
                    std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++
                              (&local_2c0,0);
        local_310 = local_300._M_node;
        local_318 = (_Base_ptr)
                    std::
                    map<int,co_ordinates,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
                    ::erase_abi_cxx11_((map<int,co_ordinates,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
                                        *)node_duplicated_data_map_local,local_300._M_node);
        bVar2 = std::operator==(&local_300,&local_240);
        if (bVar2) {
          local_320._M_node =
               (_Base_ptr)
               std::
               map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
               ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                      *)node_duplicated_data_map_local);
          p_Var3 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator--
                             (&local_320);
          local_240._M_node = p_Var3->_M_node;
        }
      }
      else {
        local_328 = (_Base_ptr)
                    std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++
                              (&local_2c0,0);
      }
    }
    local_330 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++(&limit,0);
  }
  std::operator<<((ostream *)&main_iterator,
                  "--------------------- Updated Nodes List --------------------\n");
  local_338 = (_Base_ptr)
              std::
              map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
              ::begin((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                       *)node_duplicated_data_map_local);
  limit = (iterator)local_338;
  while( true ) {
    local_340._M_node =
         (_Base_ptr)
         std::
         map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
         ::end((map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                *)node_duplicated_data_map_local);
    bVar2 = std::operator!=(&limit,&local_340);
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(&main_iterator,ppVar5->first);
    poVar9 = std::operator<<(poVar9,": [");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[0]);
    poVar9 = std::operator<<(poVar9,", ");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[1]);
    poVar9 = std::operator<<(poVar9,", ");
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator->(&limit);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar5->second).co_ord[2]);
    poVar9 = std::operator<<(poVar9,"]");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    dupe_iterator._M_node =
         (_Base_ptr)
         std::_Rb_tree_iterator<std::pair<const_int,_co_ordinates>_>::operator++(&limit,0);
  }
  std::operator<<((ostream *)&main_iterator,
                  "---------------------- Duplicated Nodes ---------------------\n");
  local_350._M_node =
       (_Base_ptr)
       std::
       map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
       ::begin((map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
                *)materials_map_local);
  while( true ) {
    local_358._M_node =
         (_Base_ptr)
         std::
         map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
         ::end((map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
                *)materials_map_local);
    bVar2 = std::operator!=(&local_350,&local_358);
    if (!bVar2) break;
    poVar9 = std::operator<<((ostream *)&main_iterator,"Original:  ");
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_node_duplication_data>_>::operator->
                       (&local_350);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar6->second).original_node);
    poVar9 = std::operator<<(poVar9,"    Duplicate:  ");
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_node_duplication_data>_>::operator->
                       (&local_350);
    pvVar11 = (void *)std::ostream::operator<<(poVar9,(ppVar6->second).duplicated_node);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    material_iterator._M_node =
         (_Base_ptr)
         std::_Rb_tree_iterator<std::pair<const_int,_node_duplication_data>_>::operator++
                   (&local_350,0);
  }
  iStack_368 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)duplicated_material_data_map_local);
  materials_map_limit._M_node._4_4_ = 0;
  nested_material_iterator =
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)duplicated_material_data_map_local);
  p_Var7 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator--(&nested_material_iterator);
  local_378._M_node = p_Var7->_M_node;
  while (bVar2 = std::operator!=(&stack0xfffffffffffffc98,&local_378), bVar2) {
    local_388._M_node = iStack_368._M_node;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_388,0);
    while( true ) {
      identified_material_duplication =
           (material_duplication_data)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)duplicated_material_data_map_local);
      bVar2 = std::operator!=(&local_388,(_Self *)&identified_material_duplication);
      if (!bVar2) break;
      bVar2 = material_compare(&stack0xfffffffffffffc98,&local_388);
      if (bVar2) {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&stack0xfffffffffffffc98);
        local_3a0.original_material_ID = ppVar8->first;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_388);
        this = _duplicates_counter;
        local_3a0.duplicated_material_ID = ppVar8->first;
        materials_map_limit._M_node._4_4_ = materials_map_limit._M_node._4_4_ + 1;
        std::pair<int,_material_duplication_data>::pair<int_&,_material_duplication_data_&,_true>
                  (&local_3ac,(int *)((long)&materials_map_limit._M_node + 4),&local_3a0);
        _Var13 = std::
                 map<int,material_duplication_data,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
                 ::insert<std::pair<int,material_duplication_data>>(this,&local_3ac);
        material_holder_iterator._M_node = (_Base_ptr)_Var13.first._M_node;
        local_3c8._M_node = local_388._M_node;
        local_3d0 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator++(&local_388,0);
        local_3d8 = local_3c8._M_node;
        local_3e0 = (_Base_ptr)
                    std::
                    map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    ::erase_abi_cxx11_((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                                        *)duplicated_material_data_map_local,local_3c8._M_node);
        bVar2 = std::operator==(&local_3c8,&local_378);
        if (bVar2) {
          local_3e8._M_node =
               (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)duplicated_material_data_map_local);
          p_Var7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator--(&local_3e8);
          local_378._M_node = p_Var7->_M_node;
        }
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_388,0);
      }
    }
    material_dupe_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator++(&stack0xfffffffffffffc98,0);
  }
  std::operator<<((ostream *)&main_iterator,
                  "------------------- Duplicated Materials -------------------\n");
  local_400._M_node =
       (_Base_ptr)
       std::
       map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
       ::begin((map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
                *)_duplicates_counter);
  while( true ) {
    local_408._M_node =
         (_Base_ptr)
         std::
         map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
         ::end((map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
                *)_duplicates_counter);
    bVar2 = std::operator!=(&local_400,&local_408);
    if (!bVar2) break;
    poVar9 = std::operator<<((ostream *)&main_iterator,"Original:  ");
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_int,_material_duplication_data>_>::operator->
                        (&local_400);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar10->second).original_material_ID);
    poVar9 = std::operator<<(poVar9,"    Duplicate:  ");
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_int,_material_duplication_data>_>::operator->
                        (&local_400);
    pvVar11 = (void *)std::ostream::operator<<(poVar9,(ppVar10->second).duplicated_material_ID);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_int,_material_duplication_data>_>::operator++
              (&local_400,0);
  }
  local_2c = 0;
  std::ofstream::close();
  iVar1 = local_2c;
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string((string *)(file_output_name.field_2._M_local_buf + 8));
  std::ofstream::~ofstream(&main_iterator);
  return iVar1;
}

Assistant:

int optimize_meshfile(  std::map<int, co_ordinates> &nodes_map,
                        std::map<int, node_duplication_data> &node_duplicated_data_map,
                        std::map<int, std::string> &materials_map,
                        std::map<int, material_duplication_data> &duplicated_material_data_map   )
{
    int exit_status = EXIT_FAILURE;
    int duplicates_counter = 0;
    std::ofstream log_file;
    std::map<int, co_ordinates>::iterator main_iterator = nodes_map.begin();
    std::map<int, co_ordinates>::iterator limit = --nodes_map.end();

    std::string logf_print_buffer;
    std::string file_output_name = "logfile.txt";
    log_file.open( file_output_name, std::ios::out | std::ios::app );
    log_file << "================== Mesh Duplication Reduction ===============\n";
    // Display the original node data
    log_file << "--------------------- Original Nodes List -------------------\n";
    while(main_iterator!=nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["<< main_iterator->second.co_ord[0] << ", "
        << main_iterator->second.co_ord[1] << ", "
        << main_iterator->second.co_ord[2] << "]\n";
        main_iterator++;
    }
    main_iterator = nodes_map.begin();
    // ------------------------------ Node duplication remover --------------------
    while(main_iterator != limit)
    {
        std::map<int, co_ordinates>::iterator nested_iterator = main_iterator;
        nested_iterator++;
        while(nested_iterator != nodes_map.end())
        {
            //compare with next
            if(co_ord_compare( main_iterator->second, nested_iterator->second ) == true)
            {
                // add co-ords to dupe data map
                node_duplication_data duplication;
                duplication.original_node = main_iterator->first;
                duplication.duplicated_node = nested_iterator->first;
                node_duplicated_data_map.insert(std::pair<int, node_duplication_data>(++duplicates_counter, duplication));
                //delete the duplicate
                std::map<int, co_ordinates>::iterator holder_iterator = nested_iterator;
                nested_iterator++;
                nodes_map.erase(holder_iterator);
                if (holder_iterator==limit)
                    limit = --nodes_map.end();
            }
            else
            {
                nested_iterator++;
            }
        }
        main_iterator++;
    }
    //print nodes map
    log_file << "--------------------- Updated Nodes List --------------------\n";
    main_iterator=nodes_map.begin();
    while(main_iterator != nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["
        << main_iterator->second.co_ord[0]
        << ", "
        << main_iterator->second.co_ord[1]
        << ", "
        << main_iterator->second.co_ord[2]
        << "]"
        << std::endl;
        main_iterator++;
    }
    //print dupe list
    log_file << "---------------------- Duplicated Nodes ---------------------\n";
    std::map<int, node_duplication_data>::iterator dupe_iterator = node_duplicated_data_map.begin();
    while (dupe_iterator != node_duplicated_data_map.end())
    {
        log_file << "Original:  " << dupe_iterator->second.original_node <<"    Duplicate:  " << dupe_iterator->second.duplicated_node << std::endl;
        dupe_iterator++;
    }
    // Material duplication remover ---------------------------------------------------------------------------------------
    std::map<int, std::string>::iterator material_iterator = materials_map.begin();
    int material_duplicates_counter = 0;
    std::map<int, std::string>::iterator materials_map_limit = --materials_map.end();
    while(material_iterator != materials_map_limit)
    {
        std::map<int, std::string>::iterator nested_material_iterator = material_iterator;
        nested_material_iterator++;
        while (nested_material_iterator != materials_map.end())
        {
            if (material_compare(material_iterator, nested_material_iterator) == true)
            {
                material_duplication_data identified_material_duplication;
                identified_material_duplication.original_material_ID = material_iterator->first;
                identified_material_duplication.duplicated_material_ID = nested_material_iterator->first;
                duplicated_material_data_map.insert(
                std::pair<int, material_duplication_data>(++material_duplicates_counter, identified_material_duplication));
                //delete the duplicate
                std::map<int, std::string>::iterator material_holder_iterator = nested_material_iterator;
                nested_material_iterator++;
                materials_map.erase(material_holder_iterator);
                if(material_holder_iterator==materials_map_limit)
                    materials_map_limit = --materials_map.end();
            }
            else
            {
                nested_material_iterator++;
            }
        }
        material_iterator++;
    }
    // Print duplication list of materials for DEBUG purposes
    log_file <<  "------------------- Duplicated Materials -------------------\n";
    std::map<int, material_duplication_data>::iterator material_dupe_iterator = duplicated_material_data_map.begin();
    while (material_dupe_iterator != duplicated_material_data_map.end())
    {
        log_file << "Original:  " << material_dupe_iterator->second.original_material_ID
        <<"    Duplicate:  " << material_dupe_iterator->second.duplicated_material_ID << std::endl;
        material_dupe_iterator++;
    }

    // end material duplication remover ------------------------------------------------------------------------------------
    exit_status = EXIT_SUCCESS;
    log_file.close();
    return exit_status;
}